

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event.cc
# Opt level: O0

event * helix::make_event(string *symbol,uint64_t timestamp,order_book *ob,trade *t,event_mask mask)

{
  string *in_RCX;
  undefined8 in_RDX;
  event *in_RSI;
  event *in_RDI;
  uint64_t in_R8;
  undefined4 in_R9D;
  undefined4 in_stack_ffffffffffffffd0;
  
  event::event(in_RSI,(event_mask)((ulong)in_RDX >> 0x20),in_RCX,in_R8,
               (order_book *)CONCAT44(in_R9D,in_stack_ffffffffffffffd0),(trade *)in_RDI);
  return in_RDI;
}

Assistant:

event make_event(const std::string& symbol, uint64_t timestamp, order_book* ob, trade* t, event_mask mask)
{
    return event{mask | ev_order_book_update | ev_trade, symbol, timestamp, ob, t};
}